

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uid.cpp
# Opt level: O0

bool fs_is_admin(void)

{
  __uid_t _Var1;
  
  _Var1 = geteuid();
  return _Var1 == 0;
}

Assistant:

bool fs_is_admin(){
  // running as admin / root / superuser
#ifdef _WIN32
	HANDLE h = nullptr;
	TOKEN_ELEVATION elevation;
	DWORD dwSize;

  const bool ok = (OpenProcessToken(GetCurrentProcess(), TOKEN_QUERY, &h) &&
     GetTokenInformation(h, TokenElevation, &elevation, sizeof(elevation), &dwSize));

  if(CloseHandle(h) && ok)  FFS_LIKELY
    return elevation.TokenIsElevated;

  fs_print_error("", __func__);
  return false;
#else
  return geteuid() == 0;
#endif
}